

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  long lVar1;
  stbi_uc *psVar2;
  bool bVar3;
  bool bVar4;
  stbi_uc sVar5;
  stbi_uc sVar6;
  stbi_uc sVar7;
  stbi_uc sVar8;
  stbi_uc sVar9;
  stbi_uc sVar10;
  stbi_uc sVar11;
  stbi_uc sVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  stbi_uc *psVar19;
  char *pcVar20;
  int iVar21;
  int iVar22;
  undefined4 in_register_0000000c;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint n;
  uint uVar27;
  uint uVar28;
  stbi__context *unaff_R12;
  uint uVar29;
  long *in_FS_OFFSET;
  stbi__context *local_b8;
  uint local_b0;
  uint local_ac;
  
  psVar2 = g->out;
  if (psVar2 != (stbi_uc *)0x0) {
    uVar27 = (uint)g->eflags >> 2 & 7;
    uVar16 = g->h * g->w;
    uVar18 = 2;
    if (uVar27 != 3) {
      uVar18 = uVar27;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar18 = uVar27;
    }
    if (uVar18 == 3) {
      if (0 < (int)uVar16) {
        uVar23 = 0;
        do {
          if (g->history[uVar23] != '\0') {
            *(undefined4 *)(g->out + uVar23 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar23 * 4);
          }
          uVar23 = uVar23 + 1;
        } while (uVar16 != uVar23);
      }
    }
    else if ((uVar18 == 2) && (0 < (int)uVar16)) {
      uVar23 = 0;
      do {
        if (g->history[uVar23] != '\0') {
          *(undefined4 *)(g->out + uVar23 * 4) = *(undefined4 *)(g->background + uVar23 * 4);
        }
        uVar23 = uVar23 + 1;
      } while (uVar16 != uVar23);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
LAB_00165d93:
    memset(g->history,0,(long)g->h * (long)g->w);
    do {
      sVar5 = stbi__get8(s);
      if (sVar5 == '!') {
        sVar5 = stbi__get8(s);
        if (sVar5 == 0xf9) {
          bVar13 = stbi__get8(s);
          if (bVar13 != 4) {
            stbi__skip(s,(uint)bVar13);
            bVar3 = true;
            goto LAB_00165f5e;
          }
          bVar13 = stbi__get8(s);
          g->eflags = (uint)bVar13;
          bVar13 = stbi__get8(s);
          bVar14 = stbi__get8(s);
          g->delay = ((uint)bVar14 * 0x200 + (uint)bVar13 * 2) * 5;
          if (-1 < (long)g->transparent) {
            g->pal[g->transparent][3] = 0xff;
          }
          if ((g->eflags & 1) != 0) {
            bVar13 = stbi__get8(s);
            g->transparent = (uint)bVar13;
            g->pal[bVar13][3] = '\0';
            goto LAB_001663e9;
          }
          if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00165f3d:
            s->img_buffer = s->img_buffer + 1;
          }
          else {
            iVar21 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
            if (0 < iVar21) goto LAB_00165f3d;
            s->img_buffer = s->img_buffer_end;
            (*(s->io).skip)(s->io_user_data,1 - iVar21);
          }
          g->transparent = -1;
        }
LAB_001663e9:
        bVar13 = stbi__get8(s);
        bVar3 = true;
        while (bVar13 != 0) {
          stbi__skip(s,(uint)bVar13);
          bVar13 = stbi__get8(s);
        }
      }
      else if (sVar5 == ';') {
        bVar3 = false;
        unaff_R12 = s;
      }
      else if (sVar5 == ',') {
        sVar5 = stbi__get8(s);
        sVar6 = stbi__get8(s);
        sVar7 = stbi__get8(s);
        local_b8 = (stbi__context *)CONCAT71(local_b8._1_7_,sVar7);
        sVar8 = stbi__get8(s);
        sVar9 = stbi__get8(s);
        sVar10 = stbi__get8(s);
        sVar11 = stbi__get8(s);
        sVar12 = stbi__get8(s);
        iVar21 = (uint)CONCAT11(sVar6,sVar5) + (uint)CONCAT11(sVar10,sVar9);
        if (iVar21 <= g->w) {
          iVar17 = (uint)CONCAT11(sVar12,sVar11) + (uint)CONCAT11(sVar8,sVar7);
          if (iVar17 <= g->h) {
            iVar22 = g->w * 4;
            g->line_size = iVar22;
            iVar26 = (uint)CONCAT11(sVar6,sVar5) << 2;
            g->start_x = iVar26;
            iVar24 = (uint)CONCAT11(sVar8,sVar7) * iVar22;
            g->start_y = iVar24;
            g->max_x = iVar21 * 4;
            iVar17 = iVar17 * iVar22;
            g->max_y = iVar17;
            g->cur_x = iVar26;
            if (CONCAT11(sVar10,sVar9) != 0) {
              iVar17 = iVar24;
            }
            g->cur_y = iVar17;
            bVar13 = stbi__get8(s);
            g->lflags = (uint)bVar13;
            if ((bVar13 & 0x40) == 0) {
              g->step = g->line_size;
              g->parse = 0;
            }
            else {
              g->step = g->line_size << 3;
              g->parse = 3;
            }
            if ((char)bVar13 < '\0') {
              iVar21 = -1;
              if ((g->eflags & 1) != 0) {
                iVar21 = g->transparent;
              }
              stbi__gif_parse_colortable(s,g->lpal,2 << (bVar13 & 7),iVar21);
              g->color_table = g->lpal[0];
            }
            else {
              if ((g->flags & 0x80) == 0) {
                pcVar20 = "missing color table";
                goto LAB_00165f50;
              }
              g->color_table = g->pal[0];
            }
            bVar13 = stbi__get8(s);
            if (bVar13 < 0xd) {
              uVar18 = 1 << (bVar13 & 0x1f);
              uVar23 = 0;
              do {
                g->codes[uVar23].prefix = -1;
                g->codes[uVar23].first = (stbi_uc)uVar23;
                g->codes[uVar23].suffix = (stbi_uc)uVar23;
                uVar23 = uVar23 + 1;
              } while (uVar18 != uVar23);
              uVar28 = (2 << (bVar13 & 0x1f)) - 1;
              local_b0 = 0xffffffff;
              bVar3 = true;
              n = 0;
              uVar27 = 0;
              iVar17 = 0;
              uVar16 = uVar18 + 2;
              local_ac = uVar28;
              iVar21 = bVar13 + 1;
              do {
                for (; iVar22 = iVar17 - iVar21, iVar17 < iVar21; iVar17 = iVar17 + 8) {
                  if (n == 0) {
                    bVar14 = stbi__get8(s);
                    if (bVar14 == 0) {
                      local_b8 = (stbi__context *)g->out;
                      goto LAB_0016634a;
                    }
                    n = (uint)bVar14;
                  }
                  n = n - 1;
                  bVar14 = stbi__get8(s);
                  uVar27 = uVar27 | (uint)bVar14 << ((byte)iVar17 & 0x1f);
                }
                bVar14 = (byte)iVar21;
                uVar29 = uVar27 & local_ac;
                bVar4 = true;
                if (uVar29 == uVar18) {
                  bVar3 = false;
                  local_b0 = 0xffffffff;
                  iVar21 = bVar13 + 1;
                  local_ac = uVar28;
                  uVar16 = uVar18 + 2;
                }
                else if (uVar29 == uVar18 + 1) {
                  while( true ) {
                    stbi__skip(s,n);
                    bVar15 = stbi__get8(s);
                    if (bVar15 == 0) break;
                    n = (uint)bVar15;
                  }
                  local_b8 = (stbi__context *)g->out;
                  n = 0;
                  bVar4 = false;
                }
                else {
                  if ((int)uVar16 < (int)uVar29) {
                    in_FS_OFFSET[-0x81] = (long)"illegal code in raster";
                  }
                  else if (bVar3) {
                    in_FS_OFFSET[-0x81] = (long)"no clear code";
                    bVar3 = true;
                  }
                  else if ((int)local_b0 < 0) {
                    if (uVar29 != uVar16) goto LAB_001662e3;
                    in_FS_OFFSET[-0x81] = (long)"illegal code in raster";
                    bVar3 = false;
                  }
                  else {
                    uVar25 = uVar16 + 1;
                    if ((int)uVar16 < 0x2000) {
                      g->codes[(int)uVar16].prefix = (stbi__int16)local_b0;
                      sVar5 = g->codes[local_b0].first;
                      g->codes[(int)uVar16].first = sVar5;
                      if (uVar29 != uVar25) {
                        sVar5 = g->codes[(int)uVar29].first;
                      }
                      g->codes[(int)uVar16].suffix = sVar5;
                      uVar16 = uVar25;
LAB_001662e3:
                      stbi__out_gif_code(g,(stbi__uint16)uVar29);
                      if ((int)uVar16 < 0x1000 && (uVar16 & local_ac) == 0) {
                        local_ac = ~(-1 << ((byte)(iVar21 + 1) & 0x1f));
                        iVar21 = iVar21 + 1;
                      }
                      bVar3 = false;
                      bVar4 = true;
                      local_b0 = uVar29;
                      goto LAB_0016623b;
                    }
                    in_FS_OFFSET[-0x81] = (long)"too many codes";
                    bVar3 = false;
                    uVar16 = uVar25;
                  }
                  bVar4 = false;
                  local_b8 = (stbi__context *)0x0;
                }
LAB_0016623b:
                uVar27 = (int)uVar27 >> (bVar14 & 0x1f);
                iVar17 = iVar22;
              } while (bVar4);
            }
            else {
              local_b8 = (stbi__context *)0x0;
            }
LAB_0016634a:
            if (local_b8 == (stbi__context *)0x0) {
              unaff_R12 = (stbi__context *)0x0;
            }
            else {
              unaff_R12 = local_b8;
              if (psVar2 == (stbi_uc *)0x0) {
                uVar18 = g->h * g->w;
                if ((int)uVar18 < 1 || g->bgindex < 1) {
                  bVar3 = false;
                }
                else {
                  uVar23 = 0;
                  do {
                    if (g->history[uVar23] == '\0') {
                      g->pal[g->bgindex][3] = 0xff;
                      *(stbi_uc (*) [4])(g->out + uVar23 * 4) = g->pal[g->bgindex];
                    }
                    uVar23 = uVar23 + 1;
                    bVar3 = false;
                  } while (uVar18 != uVar23);
                }
                goto LAB_00165f5e;
              }
            }
            bVar3 = false;
            goto LAB_00165f5e;
          }
        }
        in_FS_OFFSET[-0x81] = (long)"bad Image Descriptor";
        bVar3 = false;
        unaff_R12 = (stbi__context *)0x0;
      }
      else {
        pcVar20 = "unknown code";
LAB_00165f50:
        in_FS_OFFSET[-0x81] = (long)pcVar20;
        bVar3 = false;
        unaff_R12 = (stbi__context *)0x0;
      }
LAB_00165f5e:
      if (!bVar3) {
        return (stbi_uc *)unaff_R12;
      }
    } while( true );
  }
  sVar5 = stbi__get8(s);
  if (((((sVar5 == 'G') && (sVar5 = stbi__get8(s), sVar5 == 'I')) &&
       (sVar5 = stbi__get8(s), sVar5 == 'F')) && (sVar5 = stbi__get8(s), sVar5 == '8')) &&
     (((sVar5 = stbi__get8(s), sVar5 == '7' || (sVar5 == '9')) &&
      (sVar5 = stbi__get8(s), sVar5 == 'a')))) {
    in_FS_OFFSET[-0x81] = (long)"";
    sVar5 = stbi__get8(s);
    sVar6 = stbi__get8(s);
    g->w = (uint)CONCAT11(sVar6,sVar5);
    sVar5 = stbi__get8(s);
    sVar6 = stbi__get8(s);
    g->h = (uint)CONCAT11(sVar6,sVar5);
    bVar13 = stbi__get8(s);
    g->flags = (uint)bVar13;
    bVar13 = stbi__get8(s);
    g->bgindex = (uint)bVar13;
    bVar13 = stbi__get8(s);
    g->ratio = (uint)bVar13;
    g->transparent = -1;
    if ((g->w < 0x1000001) && (g->h < 0x1000001)) {
      if (comp != (int *)0x0) {
        *comp = 4;
      }
      bVar13 = (byte)g->flags;
      if ((char)bVar13 < '\0') {
        stbi__gif_parse_colortable(s,g->pal,2 << (bVar13 & 7),-1);
      }
      iVar21 = g->w;
      iVar17 = g->h;
      iVar22 = stbi__mad3sizes_valid(4,iVar21,iVar17,0);
      if (iVar22 != 0) {
        iVar17 = iVar17 * iVar21;
        local_b8 = (stbi__context *)(long)(iVar17 * 4);
        lVar1 = *in_FS_OFFSET + -0x430;
        psVar19 = (stbi_uc *)(*(code *)in_FS_OFFSET[-0x85])(lVar1,1);
        g->out = psVar19;
        psVar19 = (stbi_uc *)(*(code *)in_FS_OFFSET[-0x85])(lVar1,1);
        g->background = psVar19;
        unaff_R12 = (stbi__context *)(long)iVar17;
        psVar19 = (stbi_uc *)(*(code *)in_FS_OFFSET[-0x85])(lVar1);
        g->history = psVar19;
        if ((g->out != (stbi_uc *)0x0) &&
           (psVar19 != (stbi_uc *)0x0 && g->background != (stbi_uc *)0x0)) {
          memset(g->out,0,(size_t)local_b8);
          memset(g->background,0,(size_t)local_b8);
          memset(g->history,0,(size_t)unaff_R12);
          goto LAB_00165d93;
        }
        pcVar20 = "outofmem";
        goto LAB_00165d31;
      }
    }
    pcVar20 = "too large";
  }
  else {
    pcVar20 = "not GIF";
  }
LAB_00165d31:
  in_FS_OFFSET[-0x81] = (long)pcVar20;
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose;
   int first_frame;
   int pi;
   int pcount;
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0;
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background;
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame.
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1;
   } else {
      // second frame - how do we dispose of the previous one?
      dispose = (g->eflags & 0x1C) >> 2;
      pcount = g->w * g->h;

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 );
            }
         }
      } else if (dispose == 2) {
         // restore what was changed last frame to background before that frame;
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 );
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame;
      memcpy( g->background, g->out, 4 * g->w * g->h );
   }

   // clear my history;
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s);
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");

            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame,
            pcount = g->w * g->h;
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be;
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 );
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s);
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255;
                  }
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0;
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1);
                     g->transparent = -1;
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            }
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}